

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O1

void Assimp::BlenderImporter::NotSupportedObjectType(Object *obj,char *type)

{
  size_t sVar1;
  ostream *message;
  char *__s;
  char *local_190;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  local_190 = type;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Object `",8);
  __s = (obj->id).name;
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"` - type is unsupported: `",0x1a);
  message = (ostream *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       local_188,&local_190);
  std::__ostream_insert<char,std::char_traits<char>>(message,"`, skipping",0xb);
  LogFunctions<Assimp::BlenderImporter>::LogWarn((format *)message);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void BlenderImporter::NotSupportedObjectType(const Object* obj, const char* type)
{
    LogWarn((format(), "Object `",obj->id.name,"` - type is unsupported: `",type, "`, skipping" ));
}